

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrTsim.c
# Opt level: O3

void Pdr_ManExtendUndo(Aig_Man_t *pAig,Vec_Int_t *vUndo)

{
  uint uVar1;
  uint uVar2;
  int *piVar3;
  Vec_Ptr_t *pVVar4;
  int iVar5;
  byte bVar6;
  long lVar7;
  int iVar8;
  void *pvVar9;
  
  iVar8 = vUndo->nSize;
  if (0 < iVar8) {
    piVar3 = vUndo->pArray;
    pVVar4 = pAig->vObjs;
    lVar7 = 1;
    do {
      if (pVVar4 == (Vec_Ptr_t *)0x0) {
        pvVar9 = (void *)0x0;
      }
      else {
        uVar1 = piVar3[lVar7 + -1];
        if (((int)uVar1 < 0) || (pVVar4->nSize <= (int)uVar1)) {
          __assert_fail("i >= 0 && i < p->nSize",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                        ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
        }
        pvVar9 = pVVar4->pArray[uVar1];
      }
      if (iVar8 <= lVar7) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      iVar8 = *(int *)((long)pvVar9 + 0x24) >> 4;
      uVar1 = pAig->pTerSimData[iVar8];
      bVar6 = (char)*(int *)((long)pvVar9 + 0x24) * '\x02' & 0x1e;
      if ((~(uVar1 >> bVar6) & 3) != 0) {
        __assert_fail("Pdr_ManSimInfoGet(pAig, pObj) == PDR_UND",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                      ,0x102,"void Pdr_ManExtendUndo(Aig_Man_t *, Vec_Int_t *)");
      }
      uVar2 = piVar3[lVar7];
      if (2 < uVar2 - 1) {
        __assert_fail("Value >= PDR_ZER && Value <= PDR_UND",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/proof/pdr/pdrTsim.c"
                      ,0x3a,"void Pdr_ManSimInfoSet(Aig_Man_t *, Aig_Obj_t *, int)");
      }
      pAig->pTerSimData[iVar8] = (uVar2 ^ 3) << bVar6 ^ uVar1;
      iVar8 = vUndo->nSize;
      iVar5 = (int)lVar7;
      lVar7 = lVar7 + 2;
    } while (iVar5 + 1 < iVar8);
  }
  return;
}

Assistant:

void Pdr_ManExtendUndo( Aig_Man_t * pAig, Vec_Int_t * vUndo )
{
    Aig_Obj_t * pObj;
    int i, Value;
    Aig_ManForEachObjVec( vUndo, pAig, pObj, i )
    {
        Value  = Vec_IntEntry(vUndo, ++i);
        assert( Pdr_ManSimInfoGet(pAig, pObj) == PDR_UND );
        Pdr_ManSimInfoSet( pAig, pObj, Value );
    }
}